

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  void *__s1;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  uchar *d;
  int iVar11;
  long lVar12;
  size_t __n;
  bool bVar13;
  bool bVar14;
  stbi__write_context local_a0;
  void *local_48;
  long local_40;
  ulong local_38;
  
  uVar7 = (ulong)(uint)y;
  local_a0.buffer[0x30] = '\0';
  local_a0.buffer[0x31] = '\0';
  local_a0.buffer[0x32] = '\0';
  local_a0.buffer[0x33] = '\0';
  local_a0.buffer[0x34] = '\0';
  local_a0.buffer[0x35] = '\0';
  local_a0.buffer[0x36] = '\0';
  local_a0.buffer[0x37] = '\0';
  local_a0.buffer[0x38] = '\0';
  local_a0.buffer[0x39] = '\0';
  local_a0.buffer[0x3a] = '\0';
  local_a0.buffer[0x3b] = '\0';
  local_a0.buffer[0x3c] = '\0';
  local_a0.buffer[0x3d] = '\0';
  local_a0.buffer[0x3e] = '\0';
  local_a0.buffer[0x3f] = '\0';
  local_a0.buffer[0x20] = '\0';
  local_a0.buffer[0x21] = '\0';
  local_a0.buffer[0x22] = '\0';
  local_a0.buffer[0x23] = '\0';
  local_a0.buffer[0x24] = '\0';
  local_a0.buffer[0x25] = '\0';
  local_a0.buffer[0x26] = '\0';
  local_a0.buffer[0x27] = '\0';
  local_a0.buffer[0x28] = '\0';
  local_a0.buffer[0x29] = '\0';
  local_a0.buffer[0x2a] = '\0';
  local_a0.buffer[0x2b] = '\0';
  local_a0.buffer[0x2c] = '\0';
  local_a0.buffer[0x2d] = '\0';
  local_a0.buffer[0x2e] = '\0';
  local_a0.buffer[0x2f] = '\0';
  local_a0.buffer[0x10] = '\0';
  local_a0.buffer[0x11] = '\0';
  local_a0.buffer[0x12] = '\0';
  local_a0.buffer[0x13] = '\0';
  local_a0.buffer[0x14] = '\0';
  local_a0.buffer[0x15] = '\0';
  local_a0.buffer[0x16] = '\0';
  local_a0.buffer[0x17] = '\0';
  local_a0.buffer[0x18] = '\0';
  local_a0.buffer[0x19] = '\0';
  local_a0.buffer[0x1a] = '\0';
  local_a0.buffer[0x1b] = '\0';
  local_a0.buffer[0x1c] = '\0';
  local_a0.buffer[0x1d] = '\0';
  local_a0.buffer[0x1e] = '\0';
  local_a0.buffer[0x1f] = '\0';
  local_a0.buffer[0] = '\0';
  local_a0.buffer[1] = '\0';
  local_a0.buffer[2] = '\0';
  local_a0.buffer[3] = '\0';
  local_a0.buffer[4] = '\0';
  local_a0.buffer[5] = '\0';
  local_a0.buffer[6] = '\0';
  local_a0.buffer[7] = '\0';
  local_a0.buffer[8] = '\0';
  local_a0.buffer[9] = '\0';
  local_a0.buffer[10] = '\0';
  local_a0.buffer[0xb] = '\0';
  local_a0.buffer[0xc] = '\0';
  local_a0.buffer[0xd] = '\0';
  local_a0.buffer[0xe] = '\0';
  local_a0.buffer[0xf] = '\0';
  local_a0._80_8_ = 0;
  local_48 = data;
  local_a0.context = fopen(filename,"wb");
  local_a0.func = stbi__stdio_write;
  if ((FILE *)local_a0.context == (FILE *)0x0) {
    iVar2 = 0;
  }
  else {
    bVar14 = (comp - 2U & 0xfffffffd) == 0;
    if ((y | x) < 0) {
      iVar2 = 0;
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(&local_a0,(char *)0x0,0,0,(ulong)((int)(comp - (uint)bVar14) < 2 | 10),0,0,0,0,0
                    ,(ulong)(uint)x,uVar7,(ulong)(uint)(comp * 8),(ulong)((uint)bVar14 * 8));
      if (y != 0) {
        iVar2 = comp * x;
        __n = (size_t)comp;
        iVar4 = (y + -1) * iVar2;
        do {
          pvVar1 = local_48;
          uVar6 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar6;
          if (0 < x) {
            local_40 = (long)(int)(iVar2 * uVar6) + (long)local_48;
            iVar11 = 0;
            do {
              uVar10 = 1;
              if (iVar11 < x + -1) {
                __s1 = (void *)(local_40 + iVar11 * comp);
                iVar3 = bcmp(__s1,(void *)((iVar11 + 1) * comp + local_40),__n);
                iVar5 = iVar11 + 2;
                uVar10 = 2;
                if (iVar3 != 0) {
                  if (iVar5 < x) {
                    lVar12 = (long)iVar5;
                    pvVar8 = (void *)((long)pvVar1 + __n * lVar12 + (long)iVar4);
                    uVar10 = 1;
                    do {
                      lVar12 = lVar12 + 1;
                      iVar3 = bcmp(__s1,pvVar8,__n);
                      if (iVar3 == 0) goto LAB_00119697;
                      iVar3 = (int)uVar10;
                      uVar9 = iVar3 + 1;
                      uVar10 = (ulong)uVar9;
                      if (x <= lVar12) break;
                      __s1 = (void *)((long)__s1 + __n);
                      pvVar8 = (void *)((long)pvVar8 + __n);
                    } while (uVar9 < 0x7f);
                    uVar10 = (ulong)(iVar3 + 2);
                  }
                  goto LAB_00119697;
                }
                if (iVar5 < x) {
                  lVar12 = (long)iVar5;
                  pvVar8 = (void *)((long)pvVar1 + __n * lVar12 + (long)iVar4);
                  uVar9 = 2;
                  while( true ) {
                    lVar12 = lVar12 + 1;
                    iVar3 = bcmp(__s1,pvVar8,__n);
                    if (iVar3 != 0) break;
                    uVar10 = (ulong)(uVar9 + 1);
                    if ((x <= lVar12) ||
                       (pvVar8 = (void *)((long)pvVar8 + __n), bVar13 = 0x7e < uVar9,
                       uVar9 = uVar9 + 1, bVar13)) goto LAB_0011972b;
                  }
                  uVar10 = (ulong)uVar9;
                }
LAB_0011972b:
                iVar3 = local_a0.buf_used;
                if (local_a0.buf_used - 0x40U < 0xffffffbf) {
                  (*local_a0.func)(local_a0.context,local_a0.buffer,local_a0.buf_used);
                  iVar3 = 0;
                }
                local_a0.buf_used = iVar3 + 1;
                local_a0.buffer[iVar3] = (char)uVar10 + '\x7f';
                stbiw__write_pixel(&local_a0,comp,(uint)bVar14,0,(int)__s1,d);
LAB_0011978b:
                iVar3 = (int)uVar10;
              }
              else {
LAB_00119697:
                iVar3 = local_a0.buf_used;
                if (local_a0.buf_used - 0x40U < 0xffffffbf) {
                  (*local_a0.func)(local_a0.context,local_a0.buffer,local_a0.buf_used);
                  iVar3 = 0;
                }
                local_a0.buf_used = iVar3 + 1;
                local_a0.buffer[iVar3] = (char)uVar10 + 0xff;
                if ((int)uVar10 < 1) goto LAB_0011978b;
                lVar12 = (long)pvVar1 + (long)(iVar11 * comp) + (long)iVar4;
                local_38 = uVar10;
                do {
                  stbiw__write_pixel(&local_a0,comp,(uint)bVar14,0,(int)lVar12,d);
                  lVar12 = lVar12 + __n;
                  uVar10 = uVar10 - 1;
                } while (uVar10 != 0);
                iVar3 = (int)local_38;
              }
              iVar11 = iVar11 + iVar3;
            } while (iVar11 < x);
          }
          iVar4 = iVar4 - iVar2;
        } while (uVar6 != 0);
      }
      iVar2 = 1;
      if (local_a0.buf_used != 0) {
        (*local_a0.func)(local_a0.context,local_a0.buffer,local_a0.buf_used);
        local_a0._80_8_ = local_a0._80_8_ & 0xffffffff00000000;
      }
    }
    fclose((FILE *)local_a0.context);
  }
  return iVar2;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}